

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribfunction.cpp
# Opt level: O1

double __thiscall DistribFunction::getDistribSumSquares(DistribFunction *this)

{
  double *pdVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  
  if (this->numHistIntervals < 1) {
    return 0.0;
  }
  auVar6 = vpbroadcastq_avx512f();
  uVar4 = 0;
  auVar7 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar8 = ZEXT864(0) << 0x40;
  do {
    auVar9 = auVar8;
    auVar8 = vpbroadcastq_avx512f();
    auVar8 = vporq_avx512f(auVar8,auVar7);
    uVar3 = vpcmpuq_avx512f(auVar8,auVar6,2);
    pdVar1 = this->distrib + uVar4;
    auVar8._8_8_ = (ulong)((byte)(uVar3 >> 1) & 1) * (long)pdVar1[1];
    auVar8._0_8_ = (ulong)((byte)uVar3 & 1) * (long)*pdVar1;
    auVar8._16_8_ = (ulong)((byte)(uVar3 >> 2) & 1) * (long)pdVar1[2];
    auVar8._24_8_ = (ulong)((byte)(uVar3 >> 3) & 1) * (long)pdVar1[3];
    auVar8._32_8_ = (ulong)((byte)(uVar3 >> 4) & 1) * (long)pdVar1[4];
    auVar8._40_8_ = (ulong)((byte)(uVar3 >> 5) & 1) * (long)pdVar1[5];
    auVar8._48_8_ = (ulong)((byte)(uVar3 >> 6) & 1) * (long)pdVar1[6];
    auVar8._56_8_ = (uVar3 >> 7) * (long)pdVar1[7];
    auVar8 = vfmadd213pd_avx512f(auVar8,auVar8,auVar9);
    uVar4 = uVar4 + 8;
  } while ((this->numHistIntervals + 7U & 0xfffffff8) != uVar4);
  bVar2 = (bool)((byte)uVar3 & 1);
  auVar6._0_8_ = (ulong)bVar2 * auVar8._0_8_ | (ulong)!bVar2 * auVar9._0_8_;
  bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
  auVar6._8_8_ = (ulong)bVar2 * auVar8._8_8_ | (ulong)!bVar2 * auVar9._8_8_;
  bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
  auVar6._16_8_ = (ulong)bVar2 * auVar8._16_8_ | (ulong)!bVar2 * auVar9._16_8_;
  bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
  auVar6._24_8_ = (ulong)bVar2 * auVar8._24_8_ | (ulong)!bVar2 * auVar9._24_8_;
  bVar2 = (bool)((byte)(uVar3 >> 4) & 1);
  auVar6._32_8_ = (ulong)bVar2 * auVar8._32_8_ | (ulong)!bVar2 * auVar9._32_8_;
  bVar2 = (bool)((byte)(uVar3 >> 5) & 1);
  auVar6._40_8_ = (ulong)bVar2 * auVar8._40_8_ | (ulong)!bVar2 * auVar9._40_8_;
  bVar2 = (bool)((byte)(uVar3 >> 6) & 1);
  auVar6._48_8_ = (ulong)bVar2 * auVar8._48_8_ | (ulong)!bVar2 * auVar9._48_8_;
  auVar6._56_8_ = (uVar3 >> 7) * auVar8._56_8_ | (ulong)!SUB81(uVar3 >> 7,0) * auVar9._56_8_;
  auVar5 = vextractf64x4_avx512f(auVar6,1);
  auVar8 = vaddpd_avx512f(auVar6,ZEXT3264(auVar5));
  return auVar8._0_8_ + auVar8._16_8_ + auVar8._8_8_ + auVar8._24_8_;
}

Assistant:

double DistribFunction::getDistribSumSquares( void ){
    double sumSquares = 0.0;
    for ( int i = 0; i < numHistIntervals; i++ ){
        sumSquares += distrib[i]*distrib[i];
    }
    return sumSquares; 
}